

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

Ratio * __thiscall Ratio::reverse(Ratio *__return_storage_ptr__,Ratio *this)

{
  pointer pPVar1;
  PhyloTreeEdge *e;
  pointer pPVar2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> fvec;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> evec;
  
  evec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  evec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  evec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fvec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fvec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fvec.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&evec,((long)(this->eEdges).
                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->eEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x48);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&fvec,((long)(this->fEdges).
                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->fEdges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x48);
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
              ((vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&evec,pPVar2);
  }
  pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
              ((vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&fvec,pPVar2);
  }
  Ratio(__return_storage_ptr__,&fvec,&evec);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&fvec);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&evec);
  return __return_storage_ptr__;
}

Assistant:

Ratio Ratio::reverse() {
    vector<PhyloTreeEdge> evec, fvec;
    evec.reserve(eEdges.size());
    fvec.reserve(fEdges.size());
    for (auto &e : eEdges) {
        evec.emplace_back(e);
    }
    for (auto &f : fEdges) {
        fvec.emplace_back(f);
    }
    return Ratio(fvec, evec);
}